

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint64_t Catch::anon_unknown_1::estimateClockResolution(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t delta;
  uint64_t baseTicks;
  uint64_t ticks;
  size_t i;
  uint64_t startTime;
  uint64_t sum;
  
  startTime = 0;
  uVar1 = getCurrentNanosecondsSinceEpoch();
  ticks = 0;
  while( true ) {
    if (999999 < ticks) {
      return startTime / 1000000;
    }
    uVar2 = getCurrentNanosecondsSinceEpoch();
    do {
      uVar3 = getCurrentNanosecondsSinceEpoch();
    } while (uVar3 == uVar2);
    startTime = (uVar3 - uVar2) + startTime;
    if (uVar1 + 3000000000 < uVar3) break;
    ticks = ticks + 1;
  }
  return startTime / (ticks + 1);
}

Assistant:

auto estimateClockResolution() -> uint64_t {
      uint64_t sum = 0;
      static const uint64_t iterations = 1000000;

      auto startTime = getCurrentNanosecondsSinceEpoch();

      for (std::size_t i = 0; i < iterations; ++i) {
        uint64_t ticks;
        uint64_t baseTicks = getCurrentNanosecondsSinceEpoch();
        do {
          ticks = getCurrentNanosecondsSinceEpoch();
        } while (ticks == baseTicks);

        auto delta = ticks - baseTicks;
        sum += delta;

        // If we have been calibrating for over 3 seconds -- the clock
        // is terrible and we should move on.
        // TBD: How to signal that the measured resolution is probably wrong?
        if (ticks > startTime + 3 * nanosecondsInSecond) {
          return sum / (i + 1u);
        }
      }

      // We're just taking the mean, here. To do better we could take the std. dev and exclude outliers
      // - and potentially do more iterations if there's a high variance.
      return sum / iterations;
    }